

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  Printer *this_00;
  int iVar1;
  int iVar2;
  ServiceDescriptor *pSVar3;
  string_view local_28;
  int local_14;
  Generator *pGStack_10;
  int i;
  Generator *this_local;
  
  local_14 = 0;
  pGStack_10 = this;
  while( true ) {
    iVar1 = local_14;
    iVar2 = FileDescriptor::service_count(this->file_);
    if (iVar2 <= iVar1) break;
    pSVar3 = FileDescriptor::service(this->file_,local_14);
    PrintServiceClass(this,pSVar3);
    pSVar3 = FileDescriptor::service(this->file_,local_14);
    PrintServiceStub(this,pSVar3);
    this_00 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"\n");
    io::Printer::Print<>(this_00,local_28);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}